

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflect_value.c
# Opt level: O0

value value_create(void *data,size_t bytes)

{
  size_t in_RSI;
  void *in_RDI;
  value v;
  size_t in_stack_ffffffffffffffd8;
  undefined8 local_8;
  
  local_8 = value_alloc(in_stack_ffffffffffffffd8);
  if (local_8 == (value)0x0) {
    local_8 = (value)0x0;
  }
  else {
    memcpy(local_8,in_RDI,in_RSI);
  }
  return local_8;
}

Assistant:

value value_create(const void *data, size_t bytes)
{
	value v = value_alloc(bytes);

	if (v == NULL)
	{
		return NULL;
	}

	memcpy(v, data, bytes);

	return v;
}